

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O0

void EpdGetValueAndDecimalExponent(EpDouble *epd,double *value,int *exponent)

{
  int iVar1;
  undefined1 local_40 [8];
  EpDouble epd2;
  EpDouble epd1;
  int *exponent_local;
  double *value_local;
  EpDouble *epd_local;
  
  iVar1 = EpdIsNanOrInf(epd);
  if (iVar1 == 0) {
    iVar1 = EpdIsZero(epd);
    if (iVar1 == 0) {
      epd2._8_8_ = epd->type;
      EpdPow2Decimal(epd->exponent,(EpDouble *)local_40);
      EpdMultiply2Decimal((EpDouble *)&epd2.exponent,(EpDouble *)local_40);
      *value = (double)epd2._8_8_;
      *exponent = 0;
    }
    else {
      *value = 0.0;
      *exponent = 0;
    }
  }
  return;
}

Assistant:

void
EpdGetValueAndDecimalExponent(EpDouble *epd, double *value, int *exponent)
{
  EpDouble      epd1, epd2;

  if (EpdIsNanOrInf(epd))
    return;

  if (EpdIsZero(epd)) {
    *value = 0.0;
    *exponent = 0;
    return;
  }

  epd1.type.value = epd->type.value;
  epd1.exponent = 0;
  EpdPow2Decimal(epd->exponent, &epd2);
  EpdMultiply2Decimal(&epd1, &epd2);

  *value = epd1.type.value;
  *exponent = epd1.exponent;
}